

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_udiv(BtorSimBitVector *a,BtorSimBitVector *b)

{
  BtorSimBitVector *res;
  BtorSimBitVector **in_stack_00000048;
  BtorSimBitVector **in_stack_00000050;
  BtorSimBitVector *in_stack_00000058;
  BtorSimBitVector *in_stack_00000060;
  
  udiv_urem_bv(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  return (BtorSimBitVector *)0x0;
}

Assistant:

BtorSimBitVector *
btorsim_bv_udiv (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0;
  udiv_urem_bv (a, b, &res, 0);
  assert (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}